

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int convert_fast_array_to_array(JSContext *ctx,JSObject *p)

{
  int iVar1;
  uint uVar2;
  JSProperty *pJVar3;
  long in_RSI;
  JSContext *in_RDI;
  uint32_t in_stack_00000014;
  JSObject *in_stack_00000018;
  uint32_t new_count;
  uint32_t len;
  uint32_t i;
  JSValue *tab;
  JSShape *sh;
  JSProperty *pr;
  void *in_stack_ffffffffffffffa8;
  JSContext *in_stack_ffffffffffffffb0;
  JSShapeProperty **in_stack_ffffffffffffffb8;
  long lVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t v;
  JSValueUnion *local_30;
  int local_4;
  
  iVar1 = js_shape_prepare_update
                    ((JSContext *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (JSObject *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    uVar5 = *(uint *)(in_RSI + 0x40);
    uVar2 = *(int *)(*(long *)(in_RSI + 0x18) + 0x28) + uVar5;
    if ((*(uint *)(*(long *)(in_RSI + 0x18) + 0x24) < uVar2) &&
       (iVar1 = resize_properties((JSContext *)tab,_len,in_stack_00000018,in_stack_00000014),
       iVar1 != 0)) {
      local_4 = -1;
    }
    else {
      local_30 = *(JSValueUnion **)(in_RSI + 0x38);
      for (v = 0; v < uVar5; v = v + 1) {
        in_stack_ffffffffffffffb0 = in_RDI;
        lVar4 = in_RSI;
        __JS_AtomFromUInt32(v);
        pJVar3 = add_property((JSContext *)CONCAT44(v,uVar5),
                              (JSObject *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                              (JSAtom)((ulong)lVar4 >> 0x20),(int)lVar4);
        (pJVar3->u).value.u = *local_30;
        (pJVar3->u).value.tag = (int64_t)local_30[1];
        local_30 = local_30 + 2;
      }
      js_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(undefined4 *)(in_RSI + 0x40) = 0;
      *(undefined8 *)(in_RSI + 0x38) = 0;
      *(undefined4 *)(in_RSI + 0x30) = 0;
      *(byte *)(in_RSI + 5) = *(byte *)(in_RSI + 5) & 0xf7;
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int convert_fast_array_to_array(JSContext *ctx,
                                                             JSObject *p)
{
    JSProperty *pr;
    JSShape *sh;
    JSValue *tab;
    uint32_t i, len, new_count;

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    len = p->u.array.count;
    /* resize the properties once to simplify the error handling */
    sh = p->shape;
    new_count = sh->prop_count + len;
    if (new_count > sh->prop_size) {
        if (resize_properties(ctx, &p->shape, p, new_count))
            return -1;
    }

    tab = p->u.array.u.values;
    for(i = 0; i < len; i++) {
        /* add_property cannot fail here but
           __JS_AtomFromUInt32(i) fails for i > INT32_MAX */
        pr = add_property(ctx, p, __JS_AtomFromUInt32(i), JS_PROP_C_W_E);
        pr->u.value = *tab++;
    }
    js_free(ctx, p->u.array.u.values);
    p->u.array.count = 0;
    p->u.array.u.values = NULL; /* fail safe */
    p->u.array.u1.size = 0;
    p->fast_array = 0;
    return 0;
}